

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O1

SI_Error __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::FindFileComment
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char **a_pData,
          bool a_bCopyStrings)

{
  bool bVar1;
  SI_Error SVar2;
  SI_Error SVar3;
  
  SVar3 = SI_OK;
  if (this->m_pFileComment == (char *)0x0) {
    SVar3 = SI_OK;
    bVar1 = LoadMultiLineText(this,a_pData,&this->m_pFileComment,(char *)0x0,false);
    if ((bVar1) && (a_bCopyStrings)) {
      SVar2 = CopyString(this,&this->m_pFileComment);
      if (SVar2 < SI_OK) {
        SVar3 = SVar2;
      }
    }
  }
  return SVar3;
}

Assistant:

SI_Error CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::FindFileComment(SI_CHAR *&a_pData, bool a_bCopyStrings) {
	// there can only be a single file comment
	if (m_pFileComment) {
		return SI_OK;
	}

	// Load the file comment as multi-line text, this will modify all of
	// the newline characters to be single \n chars
	if (!LoadMultiLineText(a_pData, m_pFileComment, NULL, false)) {
		return SI_OK;
	}

	// copy the string if necessary
	if (a_bCopyStrings) {
		SI_Error rc = CopyString(m_pFileComment);
		if (rc < 0) return rc;
	}

	return SI_OK;
}